

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMMemoryCopyFillLowering.cpp
# Opt level: O0

void __thiscall
wasm::LLVMMemoryCopyFillLowering::createMemoryFillFunc
          (LLVMMemoryCopyFillLowering *this,Module *module)

{
  Name memory_00;
  Name memoryName;
  Index IVar1;
  reference this_00;
  pointer pMVar2;
  ExpressionList *pEVar3;
  LocalGet *pLVar4;
  LocalGet *pLVar5;
  Binary *pBVar6;
  MemorySize *left;
  Const *pCVar7;
  Binary *right;
  Expression *ifTrue;
  If *item;
  Unary *condition;
  Block *pBVar8;
  Loop *first;
  Function *pFVar9;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  optional<wasm::Type> local_160;
  optional<wasm::Type> local_148;
  string_view local_138;
  Block *local_128;
  size_t local_120;
  Type local_118;
  Type local_110;
  Type local_108;
  Type local_100;
  Address local_f8;
  Type local_f0;
  Type local_e8;
  string_view local_e0;
  Break *local_d0;
  LocalSet *local_c8;
  Store *local_c0;
  Break *local_b8;
  initializer_list<wasm::Expression_*> local_b0;
  string_view local_a0;
  string_view local_90;
  optional<wasm::Type> local_78;
  Block *local_68;
  size_t local_60;
  Type local_58;
  Type local_50;
  Block *local_48;
  Block *body;
  Name memory;
  Index size;
  Index val;
  Index dst;
  Builder b;
  Module *module_local;
  LLVMMemoryCopyFillLowering *this_local;
  
  b.wasm = module;
  Builder::Builder((Builder *)&val,module);
  memory.super_IString.str._M_str._4_4_ = 2;
  this_00 = std::
            vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ::front(&(b.wasm)->memories);
  pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(this_00);
  body = (Block *)(pMVar2->super_Importable).super_Named.name.super_IString.str._M_len;
  memory.super_IString.str._M_len =
       (size_t)(pMVar2->super_Importable).super_Named.name.super_IString.str._M_str;
  local_48 = Builder::makeBlock((Builder *)&val,(Expression *)0x0);
  pEVar3 = &local_48->list;
  wasm::Type::Type(&local_50,i32);
  pLVar4 = Builder::makeLocalGet((Builder *)&val,0,local_50);
  IVar1 = memory.super_IString.str._M_str._4_4_;
  wasm::Type::Type(&local_58,i32);
  pLVar5 = Builder::makeLocalGet((Builder *)&val,IVar1,local_58);
  pBVar6 = Builder::makeBinary((Builder *)&val,AddInt32,(Expression *)pLVar4,(Expression *)pLVar5);
  local_68 = body;
  local_60 = memory.super_IString.str._M_len;
  memoryName.super_IString.str._M_str = (char *)memory.super_IString.str._M_len;
  memoryName.super_IString.str._M_len = (size_t)body;
  left = Builder::makeMemorySize((Builder *)&val,memoryName,Unspecified);
  pCVar7 = Builder::makeConst<unsigned_int>((Builder *)&val,0x10000);
  right = Builder::makeBinary((Builder *)&val,MulInt32,(Expression *)left,(Expression *)pCVar7);
  pBVar6 = Builder::makeBinary((Builder *)&val,GtUInt32,(Expression *)pBVar6,(Expression *)right);
  ifTrue = (Expression *)Builder::makeUnreachable((Builder *)&val);
  std::optional<wasm::Type>::optional(&local_78);
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_7_ = 0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload =
       local_78.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_payload;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged =
       local_78.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_engaged;
  item = Builder::makeIf((Builder *)&val,(Expression *)pBVar6,ifTrue,(Expression *)0x0,type_00);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&pEVar3->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)item);
  pEVar3 = &local_48->list;
  wasm::Name::Name((Name *)&local_90,"out");
  wasm::Name::Name((Name *)&local_a0,"copy");
  wasm::Name::Name((Name *)&local_e0,"out");
  IVar1 = memory.super_IString.str._M_str._4_4_;
  wasm::Type::Type(&local_e8,i32);
  pLVar4 = Builder::makeLocalGet((Builder *)&val,IVar1,local_e8);
  condition = Builder::makeUnary((Builder *)&val,EqZInt32,(Expression *)pLVar4);
  local_d0 = Builder::makeBreak((Builder *)&val,(Name)local_e0,(Expression *)0x0,
                                (Expression *)condition);
  IVar1 = memory.super_IString.str._M_str._4_4_;
  wasm::Type::Type(&local_f0,i32);
  pLVar4 = Builder::makeLocalGet((Builder *)&val,IVar1,local_f0);
  pCVar7 = Builder::makeConst<int>((Builder *)&val,1);
  pBVar6 = Builder::makeBinary((Builder *)&val,SubInt32,(Expression *)pLVar4,(Expression *)pCVar7);
  local_c8 = Builder::makeLocalSet((Builder *)&val,IVar1,(Expression *)pBVar6);
  wasm::Address::Address(&local_f8,0);
  wasm::Type::Type(&local_100,i32);
  pLVar4 = Builder::makeLocalGet((Builder *)&val,0,local_100);
  IVar1 = memory.super_IString.str._M_str._4_4_;
  wasm::Type::Type(&local_108,i32);
  pLVar5 = Builder::makeLocalGet((Builder *)&val,IVar1,local_108);
  pBVar6 = Builder::makeBinary((Builder *)&val,AddInt32,(Expression *)pLVar4,(Expression *)pLVar5);
  wasm::Type::Type(&local_110,i32);
  pLVar4 = Builder::makeLocalGet((Builder *)&val,1,local_110);
  wasm::Type::Type(&local_118,i32);
  local_128 = body;
  local_120 = memory.super_IString.str._M_len;
  memory_00.super_IString.str._M_str = (char *)memory.super_IString.str._M_len;
  memory_00.super_IString.str._M_len = (size_t)body;
  local_c0 = Builder::makeStore((Builder *)&val,1,local_f8,1,(Expression *)pBVar6,
                                (Expression *)pLVar4,local_118,memory_00);
  wasm::Name::Name((Name *)&local_138,"copy");
  local_b8 = Builder::makeBreak((Builder *)&val,(Name)local_138,(Expression *)0x0,(Expression *)0x0)
  ;
  local_b0._M_array = (iterator)&local_d0;
  local_b0._M_len = 4;
  std::optional<wasm::Type>::optional(&local_148);
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_7_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload =
       local_148.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_payload;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged =
       local_148.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_engaged;
  pBVar8 = Builder::makeBlock((Builder *)&val,&local_b0,type);
  std::optional<wasm::Type>::optional(&local_160);
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_7_ = 0;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload =
       local_160.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_payload;
  type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged =
       local_160.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_engaged;
  first = Builder::makeLoop((Builder *)&val,(Name)local_a0,(Expression *)pBVar8,type_01);
  pBVar8 = Builder::makeBlock((Builder *)&val,(Name)local_90,(Expression *)first);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&pEVar3->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)pBVar8);
  pBVar8 = local_48;
  pFVar9 = Module::getFunction(b.wasm,(Name)(this->memFillFuncName).super_IString.str);
  pFVar9->body = (Expression *)pBVar8;
  return;
}

Assistant:

void createMemoryFillFunc(Module* module) {
    Builder b(*module);
    Index dst = 0, val = 1, size = 2;
    Name memory = module->memories.front()->name;
    Block* body = b.makeBlock();

    // if dst + size > memsize in bytes, then trap.
    body->list.push_back(
      b.makeIf(b.makeBinary(BinaryOp::GtUInt32,
                            b.makeBinary(BinaryOp::AddInt32,
                                         b.makeLocalGet(dst, Type::i32),
                                         b.makeLocalGet(size, Type::i32)),
                            b.makeBinary(BinaryOp::MulInt32,
                                         b.makeMemorySize(memory),
                                         b.makeConst(Memory::kPageSize))),
               b.makeUnreachable()));

    body->list.push_back(b.makeBlock(
      "out",
      b.makeLoop(
        "copy",
        b.makeBlock(
          {// break if size == 0
           b.makeBreak(
             "out",
             nullptr,
             b.makeUnary(UnaryOp::EqZInt32, b.makeLocalGet(size, Type::i32))),
           // size--
           b.makeLocalSet(size,
                          b.makeBinary(BinaryOp::SubInt32,
                                       b.makeLocalGet(size, Type::i32),
                                       b.makeConst(1))),
           // *(dst+size) = val
           b.makeStore(1,
                       0,
                       1,
                       b.makeBinary(BinaryOp::AddInt32,
                                    b.makeLocalGet(dst, Type::i32),
                                    b.makeLocalGet(size, Type::i32)),
                       b.makeLocalGet(val, Type::i32),
                       Type::i32,
                       memory),
           b.makeBreak("copy", nullptr)}))));
    module->getFunction(memFillFuncName)->body = body;
  }